

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

exr_result_t
exr_register_attr_type_handler
          (exr_context_t ctxt,char *type,
          _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr
          *unpack_func_ptr,
          _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *pack_func_ptr,
          _func_void_exr_context_t_void_ptr_int32_t *destroy_unpacked_func_ptr)

{
  _priv_exr_context_t _Var1;
  long lVar2;
  exr_attribute_t *peVar3;
  exr_result_t eVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  exr_attribute_t *ent;
  exr_attribute_t *local_60;
  _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *local_58;
  long local_50;
  long local_48;
  long local_40;
  _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *local_38;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar4 = 2;
  }
  else {
    local_58 = unpack_func_ptr;
    if ((type == (char *)0x0) || (*type == '\0')) {
      eVar4 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid type to register_attr_handler");
      return eVar4;
    }
    _Var1 = ctxt[2];
    sVar6 = strlen(type);
    if ((byte)_Var1 < sVar6) {
      eVar4 = (**(code **)(ctxt + 0x48))
                        (ctxt,0xc,"Provided type name \'%s\' too long for file (len %d, max %d)",
                         type,sVar6 & 0xffffffff,_Var1);
      return eVar4;
    }
    iVar5 = internal_exr_is_standard_type(type);
    if (iVar5 != 0) {
      eVar4 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,"Provided type name \'%s\' is a reserved / internal type name",type,
                         *(code **)(ctxt + 0x48));
      return eVar4;
    }
    eVar4 = exr_attr_list_find_by_name(ctxt,(exr_attribute_list_t *)(ctxt + 0x1e0),type,&local_60);
    if (eVar4 == 0) {
      pcVar7 = "Attribute handler for \'%s\' previously registered";
      eVar4 = 3;
    }
    else {
      local_60 = (exr_attribute_t *)0x0;
      eVar4 = exr_attr_list_add_by_type
                        (ctxt,(exr_attribute_list_t *)(ctxt + 0x1e0),type,type,0,(uint8_t **)0x0,
                         &local_60);
      if (eVar4 == 0) {
        ((local_60->field_6).m33d)->m[4] = (double)local_58;
        ((local_60->field_6).opaque)->pack_func_ptr = pack_func_ptr;
        ((local_60->field_6).opaque)->destroy_unpacked_func_ptr = destroy_unpacked_func_ptr;
        local_48 = (long)*(int *)(ctxt + 0xc4);
        if (local_48 < 1) {
          return 0;
        }
        local_50 = *(long *)(ctxt + 0x1d8);
        local_40 = 0;
        local_38 = pack_func_ptr;
        do {
          lVar2 = *(long *)(local_50 + local_40 * 8);
          lVar9 = (long)*(int *)(lVar2 + 8);
          if (0 < lVar9) {
            lVar2 = *(long *)(lVar2 + 0x10);
            lVar8 = 0;
            do {
              peVar3 = *(exr_attribute_t **)(lVar2 + lVar8 * 8);
              if ((sVar6 == peVar3->type_name_length) &&
                 (local_60 = peVar3, iVar5 = strcmp(peVar3->type_name,type), iVar5 == 0)) {
                ((peVar3->field_6).m33d)->m[4] = (double)local_58;
                ((peVar3->field_6).m33d)->m[5] = (double)local_38;
                ((peVar3->field_6).opaque)->destroy_unpacked_func_ptr = destroy_unpacked_func_ptr;
              }
              lVar8 = lVar8 + 1;
            } while (lVar9 != lVar8);
          }
          local_40 = local_40 + 1;
        } while (local_40 != local_48);
        return 0;
      }
      pcVar7 = "Unable to register custom handler for type \'%s\'";
    }
    eVar4 = (**(code **)(ctxt + 0x48))(ctxt,eVar4,pcVar7,type);
  }
  return eVar4;
}

Assistant:

exr_result_t
exr_register_attr_type_handler (
    exr_context_t ctxt,
    const char*   type,
    exr_result_t (*unpack_func_ptr) (
        exr_context_t ctxt,
        const void*   data,
        int32_t       attrsize,
        int32_t*      outsize,
        void**        outbuffer),
    exr_result_t (*pack_func_ptr) (
        exr_context_t ctxt,
        const void*   data,
        int32_t       datasize,
        int32_t*      outsize,
        void*         outbuffer),
    void (*destroy_unpacked_func_ptr) (
        exr_context_t ctxt, void* data, int32_t datasize))
{
    exr_attribute_t*      ent;
    exr_result_t          rv;
    int32_t               tlen, mlen = EXR_SHORTNAME_MAXLEN;
    size_t                slen;
    exr_attribute_list_t* curattrs;

    EXR_PROMOTE_LOCKED_CONTEXT_OR_ERROR (ctxt);

    mlen = (int32_t) pctxt->max_name_length;

    if (!type || type[0] == '\0')
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid type to register_attr_handler"));

    slen = strlen (type);
    if (slen > (size_t) mlen)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Provided type name '%s' too long for file (len %d, max %d)",
            type,
            (int) slen,
            mlen));
    tlen = (int32_t) slen;

    if (internal_exr_is_standard_type (type))
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Provided type name '%s' is a reserved / internal type name",
            type));

    rv = exr_attr_list_find_by_name (
        ctxt, &(pctxt->custom_handlers), type, &ent);
    if (rv == EXR_ERR_SUCCESS)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Attribute handler for '%s' previously registered",
            type));

    ent = NULL;
    rv  = exr_attr_list_add_by_type (
        ctxt, &(pctxt->custom_handlers), type, type, 0, NULL, &ent);
    if (rv != EXR_ERR_SUCCESS)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            rv,
            "Unable to register custom handler for type '%s'",
            type));

    ent->opaque->unpack_func_ptr           = unpack_func_ptr;
    ent->opaque->pack_func_ptr             = pack_func_ptr;
    ent->opaque->destroy_unpacked_func_ptr = destroy_unpacked_func_ptr;

    for (int p = 0; p < pctxt->num_parts; ++p)
    {
        curattrs = &(pctxt->parts[p]->attributes);
        if (curattrs)
        {
            int nattr = curattrs->num_attributes;
            for (int a = 0; a < nattr; ++a)
            {
                ent = curattrs->entries[a];
                if (ent->type_name_length == tlen &&
                    0 == strcmp (ent->type_name, type))
                {
                    ent->opaque->unpack_func_ptr = unpack_func_ptr;
                    ent->opaque->pack_func_ptr   = pack_func_ptr;
                    ent->opaque->destroy_unpacked_func_ptr =
                        destroy_unpacked_func_ptr;
                }
            }
        }
    }

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}